

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__hdr_test(stbi__context *s)

{
  int iVar1;
  stbi__context *in_RDI;
  int r;
  uint in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = stbi__hdr_test_core(in_RDI,(char *)CONCAT44(in_stack_fffffffffffffff4,
                                                      in_stack_fffffffffffffff0));
  stbi__rewind(in_RDI);
  if (iVar1 == 0) {
    iVar1 = stbi__hdr_test_core(in_RDI,(char *)(ulong)in_stack_fffffffffffffff0);
    stbi__rewind(in_RDI);
  }
  return iVar1;
}

Assistant:

static int stbi__hdr_test(stbi__context* s)
{
   int r = stbi__hdr_test_core(s, "#?RADIANCE\n");
   stbi__rewind(s);
   if(!r) {
       r = stbi__hdr_test_core(s, "#?RGBE\n");
       stbi__rewind(s);
   }
   return r;
}